

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

UniValue * __thiscall
DescribeAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeAddressVisitor *this,WitnessV0ScriptHash *id)

{
  string key;
  string key_00;
  string key_01;
  string key_02;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  int in_stack_fffffffffffffdb8;
  int iVar1;
  undefined4 in_stack_fffffffffffffdbc;
  size_type in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  _Alloc_hider in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf8 [56];
  long *local_1d0 [2];
  long local_1c0 [2];
  UniValue local_1b0;
  long *local_158 [2];
  long local_148 [2];
  UniValue local_138;
  long *local_e0 [2];
  long local_d0 [2];
  UniValue local_c0;
  long *local_68 [2];
  long local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined8 local_37;
  undefined4 local_2f;
  undefined2 local_2b;
  char local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &local_38;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_37;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_2f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_2b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_29;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_40 = 0;
  local_38 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"isscript","");
  iVar1 = CONCAT31((int3)((uint)in_stack_fffffffffffffdb8 >> 8),1);
  ::UniValue::UniValue<bool,_bool,_true>(&local_c0,(bool *)&stack0xfffffffffffffdb8);
  key._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdbc;
  key._M_dataplus._M_p._0_4_ = iVar1;
  key._M_string_length = in_stack_fffffffffffffdc0;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffffdc8;
  key.field_2._8_8_ = in_stack_fffffffffffffdd0;
  val.val._M_dataplus._M_p = in_stack_fffffffffffffde0._M_p;
  val.typ = (VType)in_stack_fffffffffffffdd8;
  val._4_4_ = SUB84(in_stack_fffffffffffffdd8,4);
  val.val._M_string_length = in_stack_fffffffffffffde8;
  val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffdf0;
  val._32_56_ = in_stack_fffffffffffffdf8;
  ::UniValue::pushKV(__return_storage_ptr__,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.val._M_dataplus._M_p != &local_c0.val.field_2) {
    operator_delete(local_c0.val._M_dataplus._M_p,local_c0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"iswitness","");
  iVar1 = CONCAT31((int3)((uint)iVar1 >> 8),1);
  ::UniValue::UniValue<bool,_bool,_true>(&local_138,(bool *)&stack0xfffffffffffffdb8);
  key_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdbc;
  key_00._M_dataplus._M_p._0_4_ = iVar1;
  key_00._M_string_length = in_stack_fffffffffffffdc0;
  key_00.field_2._M_allocated_capacity = in_stack_fffffffffffffdc8;
  key_00.field_2._8_8_ = in_stack_fffffffffffffdd0;
  val_00.val._M_dataplus._M_p = in_stack_fffffffffffffde0._M_p;
  val_00.typ = (VType)in_stack_fffffffffffffdd8;
  val_00._4_4_ = SUB84(in_stack_fffffffffffffdd8,4);
  val_00.val._M_string_length = in_stack_fffffffffffffde8;
  val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffdf0;
  val_00._32_56_ = in_stack_fffffffffffffdf8;
  ::UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_138.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.val._M_dataplus._M_p != &local_138.val.field_2) {
    operator_delete(local_138.val._M_dataplus._M_p,local_138.val.field_2._M_allocated_capacity + 1);
  }
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"witness_version","");
  iVar1 = 0;
  ::UniValue::UniValue<int,_int,_true>(&local_1b0,(int *)&stack0xfffffffffffffdb8);
  key_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdbc;
  key_01._M_dataplus._M_p._0_4_ = iVar1;
  key_01._M_string_length = in_stack_fffffffffffffdc0;
  key_01.field_2._M_allocated_capacity = in_stack_fffffffffffffdc8;
  key_01.field_2._8_8_ = in_stack_fffffffffffffdd0;
  val_01.val._M_dataplus._M_p = in_stack_fffffffffffffde0._M_p;
  val_01.typ = (VType)in_stack_fffffffffffffdd8;
  val_01._4_4_ = SUB84(in_stack_fffffffffffffdd8,4);
  val_01.val._M_string_length = in_stack_fffffffffffffde8;
  val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffffdf0;
  val_01._32_56_ = in_stack_fffffffffffffdf8;
  ::UniValue::pushKV(__return_storage_ptr__,key_01,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.val._M_dataplus._M_p != &local_1b0.val.field_2) {
    operator_delete(local_1b0.val._M_dataplus._M_p,local_1b0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_158[0] != local_148) {
    operator_delete(local_158[0],local_148[0] + 1);
  }
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"witness_program","");
  s.m_size = 0x20;
  s.m_data = (uchar *)id;
  HexStr_abi_cxx11_((string *)&stack0xfffffffffffffdb8,s);
  ::UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)&stack0xfffffffffffffdd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffdb8);
  key_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdbc;
  key_02._M_dataplus._M_p._0_4_ = iVar1;
  key_02._M_string_length = in_stack_fffffffffffffdc0;
  key_02.field_2._M_allocated_capacity = in_stack_fffffffffffffdc8;
  key_02.field_2._8_8_ = in_stack_fffffffffffffdd0;
  val_02.val._M_dataplus._M_p = in_stack_fffffffffffffde0._M_p;
  val_02.typ = (VType)in_stack_fffffffffffffdd8;
  val_02._4_4_ = SUB84(in_stack_fffffffffffffdd8,4);
  val_02.val._M_string_length = in_stack_fffffffffffffde8;
  val_02.val.field_2._M_allocated_capacity = in_stack_fffffffffffffdf0;
  val_02._32_56_ = in_stack_fffffffffffffdf8;
  ::UniValue::pushKV(__return_storage_ptr__,key_02,val_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffe18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe00);
  if (in_stack_fffffffffffffde0._M_p != &stack0xfffffffffffffdf0) {
    operator_delete(in_stack_fffffffffffffde0._M_p,in_stack_fffffffffffffdf0 + 1);
  }
  if ((undefined1 *)CONCAT44(in_stack_fffffffffffffdbc,iVar1) != &stack0xfffffffffffffdc8) {
    operator_delete((undefined1 *)CONCAT44(in_stack_fffffffffffffdbc,iVar1),
                    in_stack_fffffffffffffdc8 + 1);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessV0ScriptHash& id) const
    {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("isscript", true);
        obj.pushKV("iswitness", true);
        obj.pushKV("witness_version", 0);
        obj.pushKV("witness_program", HexStr(id));
        return obj;
    }